

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O3

cmCTestGenericHandler * __thiscall
cmCTestSubmitCommand::InitializeHandler(cmCTestSubmitCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  pointer pbVar3;
  bool bVar4;
  cmValue cVar5;
  cmCTestSubmitHandler *this_00;
  char *value;
  pointer name;
  pointer pcVar6;
  string_view arg;
  string_view arg_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  notesFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraFiles;
  undefined1 local_88 [8];
  undefined1 auStack_80 [24];
  _Base_ptr local_68;
  size_t local_60;
  Part local_54;
  cmCTestSubmitHandler *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pcVar6 = auStack_80 + 8;
  if ((this->SubmitURL)._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_88 = (undefined1  [8])pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CTEST_SUBMIT_URL","");
    cVar5 = cmMakefile::GetDefinition(pcVar1,(string *)local_88);
    if (local_88 != (undefined1  [8])pcVar6) {
      operator_delete((void *)local_88,auStack_80._8_8_ + 1);
    }
    if (cVar5.Value == (string *)0x0) {
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      local_88 = (undefined1  [8])pcVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CTEST_DROP_METHOD","");
      cmCTest::SetCTestConfigurationFromCMakeVariable
                (pcVar2,pcVar1,"DropMethod",(string *)local_88,
                 (this->super_cmCTestHandlerCommand).Quiet);
      if (local_88 != (undefined1  [8])pcVar6) {
        operator_delete((void *)local_88,auStack_80._8_8_ + 1);
      }
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      local_88 = (undefined1  [8])pcVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CTEST_DROP_SITE_USER","");
      cmCTest::SetCTestConfigurationFromCMakeVariable
                (pcVar2,pcVar1,"DropSiteUser",(string *)local_88,
                 (this->super_cmCTestHandlerCommand).Quiet);
      if (local_88 != (undefined1  [8])pcVar6) {
        operator_delete((void *)local_88,auStack_80._8_8_ + 1);
      }
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      local_88 = (undefined1  [8])pcVar6;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_88,"CTEST_DROP_SITE_PASSWORD","");
      cmCTest::SetCTestConfigurationFromCMakeVariable
                (pcVar2,pcVar1,"DropSitePassword",(string *)local_88,
                 (this->super_cmCTestHandlerCommand).Quiet);
      if (local_88 != (undefined1  [8])pcVar6) {
        operator_delete((void *)local_88,auStack_80._8_8_ + 1);
      }
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      local_88 = (undefined1  [8])pcVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CTEST_DROP_SITE","");
      cmCTest::SetCTestConfigurationFromCMakeVariable
                (pcVar2,pcVar1,"DropSite",(string *)local_88,
                 (this->super_cmCTestHandlerCommand).Quiet);
      if (local_88 != (undefined1  [8])pcVar6) {
        operator_delete((void *)local_88,auStack_80._8_8_ + 1);
      }
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      local_88 = (undefined1  [8])pcVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CTEST_DROP_LOCATION","");
      cmCTest::SetCTestConfigurationFromCMakeVariable
                (pcVar2,pcVar1,"DropLocation",(string *)local_88,
                 (this->super_cmCTestHandlerCommand).Quiet);
      if (local_88 != (undefined1  [8])pcVar6) {
        operator_delete((void *)local_88,auStack_80._8_8_ + 1);
      }
      goto LAB_001eb875;
    }
  }
  else {
    cVar5.Value = &this->SubmitURL;
  }
  cmCTest::SetCTestConfiguration
            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"SubmitURL",cVar5.Value,
             (this->super_cmCTestHandlerCommand).Quiet);
LAB_001eb875:
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CTEST_CURL_OPTIONS","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"CurlOptions",(string *)local_88,
             (this->super_cmCTestHandlerCommand).Quiet);
  if (local_88 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_88,auStack_80._8_8_ + 1);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"CTEST_SUBMIT_INACTIVITY_TIMEOUT","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"SubmitInactivityTimeout",(string *)local_88,
             (this->super_cmCTestHandlerCommand).Quiet);
  if (local_88 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_88,auStack_80._8_8_ + 1);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_88 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CTEST_NOTES_FILES","");
  cVar5 = cmMakefile::GetDefinition(pcVar1,(string *)local_88);
  if (local_88 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_88,auStack_80._8_8_ + 1);
  }
  if (cVar5.Value != (string *)0x0) {
    arg._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar5.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_88,arg,false);
    cmCTest::GenerateNotesFile
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_88);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_88 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CTEST_EXTRA_SUBMIT_FILES","");
  cVar5 = cmMakefile::GetDefinition(pcVar1,(string *)local_88);
  if (local_88 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_88,auStack_80._8_8_ + 1);
  }
  if (cVar5.Value != (string *)0x0) {
    arg_00._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
    arg_00._M_len = (cVar5.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_(&local_48,arg_00,false);
    bVar4 = cmCTest::SubmitExtraFiles
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,&local_48);
    if (!bVar4) {
      local_88 = (undefined1  [8])pcVar6;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_88,"problem submitting extra files.","");
      cmCommand::SetError((cmCommand *)this,(string *)local_88);
      if (local_88 != (undefined1  [8])pcVar6) {
        operator_delete((void *)local_88,auStack_80._8_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      return (cmCTestGenericHandler *)0x0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  this_00 = cmCTest::GetSubmitHandler
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(this_00->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])(this_00);
  if ((this->Files).
      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_engaged == true) {
    auStack_80._16_8_ = auStack_80;
    local_88 = (undefined1  [8])0x0;
    auStack_80._0_8_ = (pointer)0x0;
    auStack_80._8_8_ = 0;
    local_60 = 0;
    local_68 = (_Base_ptr)auStack_80._16_8_;
    cmCTestSubmitHandler::SelectParts
              (this_00,(set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
                        *)local_88);
    std::
    _Rb_tree<cmCTest::Part,_cmCTest::Part,_std::_Identity<cmCTest::Part>,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
    ::~_Rb_tree((_Rb_tree<cmCTest::Part,_cmCTest::Part,_std::_Identity<cmCTest::Part>,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
                 *)local_88);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_88,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                &(this->Files).
                 super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_payload._M_value.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ,(this->Files).
                super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_payload._M_value.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    cmCTestSubmitHandler::SelectFiles
              (this_00,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_88);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88);
  }
  if ((this->Parts).
      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_engaged == true) {
    name = *(pointer *)
            &(this->Parts).
             super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_payload._M_value.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    pbVar3 = (this->Parts).
             super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_payload._M_value.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    auStack_80._8_8_ = 0;
    local_88 = (undefined1  [8])0x0;
    auStack_80._0_8_ = (pointer)0x0;
    local_60 = 0;
    auStack_80._16_8_ = (_Base_ptr)auStack_80;
    local_68 = (_Base_ptr)auStack_80;
    local_50 = this_00;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88;
    if (name != pbVar3) {
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88;
      do {
        local_54 = cmCTest::GetPartFromName
                             ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,name);
        std::
        _Rb_tree<cmCTest::Part,cmCTest::Part,std::_Identity<cmCTest::Part>,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>>
        ::
        _M_insert_unique_<cmCTest::Part,std::_Rb_tree<cmCTest::Part,cmCTest::Part,std::_Identity<cmCTest::Part>,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>>::_Alloc_node>
                  ((_Rb_tree<cmCTest::Part,cmCTest::Part,std::_Identity<cmCTest::Part>,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>>
                    *)local_88,(_Base_ptr)auStack_80,&local_54,(_Alloc_node *)&local_48);
        name = name + 1;
      } while (name != pbVar3);
    }
    this_00 = local_50;
    cmCTestSubmitHandler::SelectParts
              (local_50,(set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
                         *)local_88);
    std::
    _Rb_tree<cmCTest::Part,_cmCTest::Part,_std::_Identity<cmCTest::Part>,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
    ::~_Rb_tree((_Rb_tree<cmCTest::Part,_cmCTest::Part,_std::_Identity<cmCTest::Part>,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
                 *)local_88);
  }
  pcVar6 = auStack_80 + 8;
  if ((this->HttpHeaders).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->HttpHeaders).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this_00->HttpHeaders,
                &(this->HttpHeaders).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  }
  local_88 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"RetryDelay","");
  cmCTestGenericHandler::SetOption
            (&this_00->super_cmCTestGenericHandler,(string *)local_88,(cmValue)&this->RetryDelay);
  if (local_88 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_88,auStack_80._8_8_ + 1);
  }
  local_88 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"RetryCount","");
  cmCTestGenericHandler::SetOption
            (&this_00->super_cmCTestGenericHandler,(string *)local_88,(cmValue)&this->RetryCount);
  if (local_88 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_88,auStack_80._8_8_ + 1);
  }
  local_88 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"InternalTest","");
  value = "OFF";
  if (this->InternalTest != false) {
    value = "ON";
  }
  cmCTestGenericHandler::SetOption(&this_00->super_cmCTestGenericHandler,(string *)local_88,value);
  if (local_88 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_88,auStack_80._8_8_ + 1);
  }
  (this_00->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  if (this->CDashUpload == true) {
    local_88 = (undefined1  [8])pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CDashUploadFile","");
    cmCTestGenericHandler::SetOption
              (&this_00->super_cmCTestGenericHandler,(string *)local_88,
               (cmValue)&this->CDashUploadFile);
    if (local_88 != (undefined1  [8])pcVar6) {
      operator_delete((void *)local_88,auStack_80._8_8_ + 1);
    }
    local_88 = (undefined1  [8])pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"CDashUploadType","");
    cmCTestGenericHandler::SetOption
              (&this_00->super_cmCTestGenericHandler,(string *)local_88,
               (cmValue)&this->CDashUploadType);
    if (local_88 != (undefined1  [8])pcVar6) {
      operator_delete((void *)local_88,auStack_80._8_8_ + 1);
    }
  }
  return &this_00->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestSubmitCommand::InitializeHandler()
{
  cmValue submitURL = !this->SubmitURL.empty()
    ? cmValue(this->SubmitURL)
    : this->Makefile->GetDefinition("CTEST_SUBMIT_URL");

  if (submitURL) {
    this->CTest->SetCTestConfiguration("SubmitURL", *submitURL, this->Quiet);
  } else {
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropMethod", "CTEST_DROP_METHOD", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSiteUser", "CTEST_DROP_SITE_USER", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSitePassword", "CTEST_DROP_SITE_PASSWORD",
      this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSite", "CTEST_DROP_SITE", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropLocation", "CTEST_DROP_LOCATION", this->Quiet);
  }

  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CurlOptions", "CTEST_CURL_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "SubmitInactivityTimeout",
    "CTEST_SUBMIT_INACTIVITY_TIMEOUT", this->Quiet);

  cmValue notesFilesVariable =
    this->Makefile->GetDefinition("CTEST_NOTES_FILES");
  if (notesFilesVariable) {
    std::vector<std::string> notesFiles = cmExpandedList(*notesFilesVariable);
    this->CTest->GenerateNotesFile(notesFiles);
  }

  cmValue extraFilesVariable =
    this->Makefile->GetDefinition("CTEST_EXTRA_SUBMIT_FILES");
  if (extraFilesVariable) {
    std::vector<std::string> extraFiles = cmExpandedList(*extraFilesVariable);
    if (!this->CTest->SubmitExtraFiles(extraFiles)) {
      this->SetError("problem submitting extra files.");
      return nullptr;
    }
  }

  cmCTestSubmitHandler* handler = this->CTest->GetSubmitHandler();
  handler->Initialize();

  // If no FILES or PARTS given, *all* PARTS are submitted by default.
  //
  // If FILES are given, but not PARTS, only the FILES are submitted
  // and *no* PARTS are submitted.
  //  (This is why we select the empty "noParts" set in the
  //   if(this->Files) block below...)
  //
  // If PARTS are given, only the selected PARTS are submitted.
  //
  // If both PARTS and FILES are given, only the selected PARTS *and*
  // all the given FILES are submitted.

  // If given explicit FILES to submit, pass them to the handler.
  //
  if (this->Files) {
    // Intentionally select *no* PARTS. (Pass an empty set.) If PARTS
    // were also explicitly mentioned, they will be selected below...
    // But FILES with no PARTS mentioned should just submit the FILES
    // without any of the default parts.
    //
    handler->SelectParts(std::set<cmCTest::Part>());
    handler->SelectFiles(
      std::set<std::string>(this->Files->begin(), this->Files->end()));
  }

  // If a PARTS option was given, select only the named parts for submission.
  //
  if (this->Parts) {
    auto parts =
      cmMakeRange(*(this->Parts)).transform([this](std::string const& arg) {
        return this->CTest->GetPartFromName(arg);
      });
    handler->SelectParts(std::set<cmCTest::Part>(parts.begin(), parts.end()));
  }

  // Pass along any HTTPHEADER to the handler if this option was given.
  if (!this->HttpHeaders.empty()) {
    handler->SetHttpHeaders(this->HttpHeaders);
  }

  handler->SetOption("RetryDelay", this->RetryDelay);
  handler->SetOption("RetryCount", this->RetryCount);
  handler->SetOption("InternalTest", this->InternalTest ? "ON" : "OFF");

  handler->SetQuiet(this->Quiet);

  if (this->CDashUpload) {
    handler->SetOption("CDashUploadFile", this->CDashUploadFile);
    handler->SetOption("CDashUploadType", this->CDashUploadType);
  }
  return handler;
}